

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

Int64FeatureType * __thiscall
CoreML::Specification::DictionaryFeatureType::_internal_mutable_int64keytype
          (DictionaryFeatureType *this)

{
  bool bVar1;
  Arena *arena;
  Int64FeatureType *pIVar2;
  DictionaryFeatureType *this_local;
  
  bVar1 = _internal_has_int64keytype(this);
  if (!bVar1) {
    clear_KeyType(this);
    set_has_int64keytype(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pIVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::Int64FeatureType>(arena);
    (this->KeyType_).int64keytype_ = pIVar2;
  }
  return (this->KeyType_).int64keytype_;
}

Assistant:

inline ::CoreML::Specification::Int64FeatureType* DictionaryFeatureType::_internal_mutable_int64keytype() {
  if (!_internal_has_int64keytype()) {
    clear_KeyType();
    set_has_int64keytype();
    KeyType_.int64keytype_ = CreateMaybeMessage< ::CoreML::Specification::Int64FeatureType >(GetArenaForAllocation());
  }
  return KeyType_.int64keytype_;
}